

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O2

int __thiscall zstr::ifstream::open(ifstream *this,char *__file,int __oflag,...)

{
  _func_int *p_Var1;
  int iVar2;
  istreambuf *this_00;
  long *plVar3;
  undefined1 local_130 [280];
  
  strict_fstream::ifstream::open((ifstream *)&(this->super_istream).field_0x10,__file,__oflag);
  p_Var1 = (this->super_istream)._vptr_basic_istream[-3];
  this_00 = (istreambuf *)operator_new(0x80);
  istreambuf::istreambuf(this_00,(streambuf *)&(this->super_istream).field_0x20,0x100000,true,0);
  plVar3 = (long *)std::ios::rdbuf((streambuf *)
                                   ((long)&(this->super_istream)._vptr_basic_istream + (long)p_Var1)
                                  );
  std::istream::istream
            (local_130,
             *(streambuf **)
              (&(this->super_istream).field_0xe8 +
              (long)(this->super_istream)._vptr_basic_istream[-3]));
  std::istream::swap(&this->super_istream);
  iVar2 = std::istream::~istream(local_130);
  if (plVar3 != (long *)0x0) {
    iVar2 = (**(code **)(*plVar3 + 8))(plVar3);
  }
  return iVar2;
}

Assistant:

void open(const std::string filename,
            std::ios_base::openmode mode = std::ios_base::in) {
    _fs.open(filename, mode
#ifdef _WIN32  // to avoid problems with conversion of \r\n, only windows as
               // otherwise there are problems on mac
                           | std::ios_base::binary
#endif
    );
    // make sure the previous buffer is deleted by putting it into a unique_ptr
    // and set a new one after opening file
    std::unique_ptr<std::streambuf> oldbuf(rdbuf(new istreambuf(_fs.rdbuf())));
    // call move assignment operator on istream which does not alter the stream
    // buffer
    std::istream::operator=(std::istream(rdbuf()));
  }